

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O2

bool __thiscall ON_BezierCurve::IncreaseDegree(ON_BezierCurve *this,int desired_degree)

{
  bool bVar1;
  int order;
  
  if (desired_degree < 1) {
    bVar1 = false;
  }
  else {
    bVar1 = true;
    if (this->m_order + -1 != desired_degree) {
      if (desired_degree < this->m_order) {
LAB_003fcd63:
        bVar1 = false;
      }
      else {
        ReserveCVCapacity(this,(desired_degree + 1) * this->m_cv_stride);
        order = this->m_order;
        bVar1 = false;
        while (order <= desired_degree) {
          bVar1 = ON_IncreaseBezierDegree
                            (this->m_dim,this->m_is_rat != 0,order,this->m_cv_stride,this->m_cv);
          if (!bVar1) goto LAB_003fcd63;
          order = this->m_order + 1;
          this->m_order = order;
          bVar1 = true;
        }
      }
    }
  }
  return bVar1;
}

Assistant:

bool ON_BezierCurve::IncreaseDegree( int desired_degree )
{
  bool rc = false;
  if ( desired_degree > 0 ) {
    if ( desired_degree == m_order-1 )
      rc = true;
    else if ( desired_degree >= m_order ) {
      ReserveCVCapacity( m_cv_stride*(desired_degree+1) );
      while ( m_order <= desired_degree ) {
        rc = ON_IncreaseBezierDegree( m_dim, m_is_rat, m_order, m_cv_stride, m_cv )?true:false;
        if ( !rc )
          break;
        m_order++;
      }
    }
  }
  return rc;
}